

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateDefaultOptionalValues(Result *__return_storage_ptr__,Model *format)

{
  uint32_t uVar1;
  Rep *pRVar2;
  void **ppvVar3;
  undefined1 *puVar4;
  long lVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  allocator<char> local_31;
  string local_30;
  
  puVar4 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar4 == (ModelDescription *)0x0) {
    puVar4 = Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (((ModelDescription *)puVar4)->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar3 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  uVar1 = format->_oneof_case_[0];
  lVar5 = 0;
  do {
    if ((long)(((ModelDescription *)puVar4)->input_).super_RepeatedPtrFieldBase.current_size_ * 8 ==
        lVar5) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    puVar6 = *(undefined1 **)(*(long *)((long)ppvVar3 + lVar5) + 0x20);
    if (puVar6 == (undefined1 *)0x0) {
      puVar6 = Specification::_FeatureType_default_instance_;
    }
    if (puVar6[0x10] == '\x01') {
      puVar7 = Specification::_ArrayFeatureType_default_instance_;
      if (*(int *)(puVar6 + 0x24) == 5) {
        puVar7 = *(undefined1 **)(puVar6 + 0x18);
      }
      if (((ulong)*(uint *)(puVar7 + 0x40) < 0x3e) &&
         ((0x2008020000000000U >> ((ulong)*(uint *)(puVar7 + 0x40) & 0x3f) & 1) != 0)) {
        if (((uVar1 != 0x12f) && (((uVar1 != 0x193 && (uVar1 != 500)) && (uVar1 != 0x1f6)))) &&
           (uVar1 != 3000)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,
                     "Default optional values are only allowed for neural networks.",&local_31);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
LAB_0026cf98:
          std::__cxx11::string::~string((string *)&local_30);
          return __return_storage_ptr__;
        }
        if (format->specificationversion_ < 5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,
                     "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!"
                     ,&local_31);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
          goto LAB_0026cf98;
        }
      }
    }
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

inline Result validateDefaultOptionalValues(const Specification::Model& format) {
        // - Validate default optional values for NN Model that
        //   - Has default value set if input is optional and spec 5 model
        // - Error out if model is not Neural Network
        const Specification::ModelDescription& description = format.description();

        for (const auto& input : description.input()) {
            if (input.type().isoptional()) {
                switch (input.type().multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        // Default value for optional inputs is applicable
                        // only for NeuralNetwork models with Spec 5 (iOS 14) onwards.
                        if (format.Type_case() != Specification::Model::kNeuralNetwork &&
                            format.Type_case() != Specification::Model::kNeuralNetworkRegressor &&
                            format.Type_case() != Specification::Model::kNeuralNetworkClassifier &&
                            format.Type_case() != Specification::Model::kSerializedModel &&
                            format.Type_case() != Specification::Model::kMlProgram) {
                            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                          "Default optional values are only allowed for neural networks.");
                        }
                        if (format.specificationversion() < MLMODEL_SPECIFICATION_VERSION_IOS14) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Default value for optional inputs is supported from specification 5 (iOS 14) onwards!");
                        }
                        break;
                    default:
                        break;
                }
            }
        }
        return Result();
    }